

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

void __thiscall WithBlock::~WithBlock(WithBlock *this)

{
  pointer ppCVar1;
  ContextChange *pCVar2;
  int4 i;
  ulong uVar3;
  
  if (this->pateq != (PatternEquation *)0x0) {
    PatternEquation::release((PatternEquation *)this->pateq);
  }
  uVar3 = 0;
  while( true ) {
    ppCVar1 = (this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->contvec).
                      super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar3) break;
    pCVar2 = ppCVar1[uVar3];
    if (pCVar2 != (ContextChange *)0x0) {
      (**(code **)(*(long *)pCVar2 + 8))();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>::~_Vector_base
            (&(this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>)
  ;
  return;
}

Assistant:

WithBlock::~WithBlock(void)

{
  if (pateq != (PatternEquation *)0)
    PatternEquation::release(pateq);
  for(int4 i=0;i<contvec.size();++i) {
    delete contvec[i];
  }
}